

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int ptls_openssl_load_certificates(ptls_context_t *ctx,X509 *cert,stack_st_X509 *chain)

{
  int iVar1;
  ptls_iovec_t *dst;
  X509 *cert_00;
  size_t sVar2;
  size_t sVar3;
  ptls_iovec_t *dst_00;
  int iVar4;
  ptls_iovec_t *ppVar5;
  
  if (chain == (stack_st_X509 *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = OPENSSL_sk_num(chain);
  }
  if ((ctx->certificates).list != (ptls_iovec_t *)0x0) {
    __assert_fail("ctx->certificates.list == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                  0x66b,
                  "int ptls_openssl_load_certificates(ptls_context_t *, X509 *, struct stack_st_X509 *)"
                 );
  }
  sVar2 = (size_t)(int)(iVar1 + (uint)(cert != (X509 *)0x0));
  dst = (ptls_iovec_t *)malloc(sVar2 << 4);
  if (dst == (ptls_iovec_t *)0x0) {
    iVar1 = 0x201;
  }
  else {
    ppVar5 = dst;
    if (cert == (X509 *)0x0) {
      sVar3 = 0;
    }
    else {
      iVar1 = serialize_cert(cert,dst);
      sVar3 = 1;
      if (iVar1 != 0) goto LAB_0010b827;
    }
    if ((chain != (stack_st_X509 *)0x0) && (iVar1 = OPENSSL_sk_num(chain), iVar1 != 0)) {
      dst_00 = (ptls_iovec_t *)((long)&dst->base + (ulong)(uint)((int)sVar3 << 4));
      iVar4 = 0;
      do {
        sVar3 = sVar3 + 1;
        cert_00 = (X509 *)OPENSSL_sk_value(chain,iVar4);
        iVar1 = serialize_cert(cert_00,dst_00);
        if (iVar1 != 0) {
          for (; sVar3 != 0; sVar3 = sVar3 - 1) {
LAB_0010b827:
            free(ppVar5->base);
            ppVar5 = ppVar5 + 1;
          }
          free(dst);
          return iVar1;
        }
        iVar4 = iVar4 + 1;
        iVar1 = OPENSSL_sk_num(chain);
        dst_00 = dst_00 + 1;
      } while (iVar4 != iVar1);
    }
    if (sVar3 != sVar2) {
      __assert_fail("slot == count",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x67d,
                    "int ptls_openssl_load_certificates(ptls_context_t *, X509 *, struct stack_st_X509 *)"
                   );
    }
    (ctx->certificates).list = dst;
    (ctx->certificates).count = sVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ptls_openssl_load_certificates(ptls_context_t *ctx, X509 *cert, STACK_OF(X509) * chain)
{
    ptls_iovec_t *list = NULL;
    size_t slot = 0, count = (cert != NULL) + (chain != NULL ? sk_X509_num(chain) : 0);
    int ret;

    assert(ctx->certificates.list == NULL);

    if ((list = malloc(sizeof(*list) * count)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (cert != NULL) {
        if ((ret = serialize_cert(cert, list + slot++)) != 0)
            goto Exit;
    }
    if (chain != NULL) {
        int i;
        for (i = 0; i != sk_X509_num(chain); ++i) {
            if ((ret = serialize_cert(sk_X509_value(chain, i), list + slot++)) != 0)
                goto Exit;
        }
    }

    assert(slot == count);

    ctx->certificates.list = list;
    ctx->certificates.count = count;
    ret = 0;

Exit:
    if (ret != 0 && list != NULL) {
        size_t i;
        for (i = 0; i != slot; ++i)
            free(list[i].base);
        free(list);
    }
    return ret;
}